

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O1

void bloaty::ReadDWARFDebugInfo
               (InfoReader *reader,Section section,DualMap *symbol_map,RangeSink *sink)

{
  uint16_t uVar1;
  pointer pAVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  string_view sVar5;
  string_view sVar6;
  AttrValue val;
  AttrValue val_00;
  bool bVar7;
  Abbrev *pAVar8;
  long *plVar9;
  string_view *data;
  RangeSink *pRVar10;
  RangeSink *pRVar11;
  undefined1 **ppuVar12;
  size_t in_R8;
  char *pcVar13;
  pointer pAVar14;
  pointer *pppVar15;
  string_view name;
  string_view name_00;
  string_view sVar16;
  string_view sVar17;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> file;
  DwoFilePointer dwo_info;
  DIEReader die_reader;
  CU cu;
  File dwo_dwarf;
  CUIter iter;
  GeneralDIE compileunit_die;
  InputFileFactory local_370;
  anon_union_16_2_fba5e7b8_for_AttrValue_0 local_368;
  pointer local_358 [2];
  File *local_348;
  undefined1 *local_340;
  long local_338;
  undefined1 local_330;
  undefined7 uStack_32f;
  undefined1 *local_320;
  long local_318;
  undefined1 local_310;
  undefined7 uStack_30f;
  undefined1 local_300 [32];
  InfoReader *local_2e0;
  undefined1 local_2d8 [8];
  undefined1 local_2d0 [128];
  ArenaStringPtr local_250;
  ArenaStringPtr AStack_248;
  uint64_t local_240;
  _Any_data _Stack_238;
  _Manager_type p_Stack_228;
  _Invoker_type local_220;
  anon_union_16_2_fba5e7b8_for_AttrValue_0 local_218;
  undefined8 local_208;
  pointer ppStack_200;
  undefined1 local_1f0;
  undefined1 local_1e0;
  uint64_t local_1d8;
  char local_1d0;
  undefined1 local_1c0;
  undefined1 local_1b0;
  undefined1 local_1a0;
  undefined1 local_190;
  undefined1 local_180;
  undefined1 local_170;
  char local_168;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  CUIter local_100;
  GeneralDIE local_e8;
  
  local_348 = (File *)symbol_map;
  local_2e0 = reader;
  dwarf::InfoReader::GetCUIter(&local_100,reader,section,0);
  local_2d0._96_8_ = local_2d0 + 0x70;
  local_2d0._24_8_ = (InputFile *)0x0;
  local_2d0._32_8_ = (Arena *)0x0;
  local_2d0._8_8_ = 0;
  local_2d0._16_8_ = (_Base_ptr)0x0;
  local_2d0._104_8_ = (Arena *)0x0;
  local_2d0[0x70] = '\0';
  local_250.ptr_ = (string *)0x0;
  AStack_248.ptr_ = (string *)0x0;
  local_240 = 0;
  _Stack_238._M_unused._M_object = (void *)0x0;
  _Stack_238._8_8_ = 0;
  p_Stack_228 = (_Manager_type)0x0;
  local_220 = (_Invoker_type)0x0;
  local_128._8_8_ = local_2d0;
  pcStack_110 = std::
                _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/dwarf.cc:591:32)>
                ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/dwarf.cc:591:32)>
              ::_M_manager;
  local_128._M_unused._M_object = sink;
  std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator=
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *)&_Stack_238,
             (function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *)&local_128);
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  local_300._24_8_ = &PTR__InputFileFactory_005dc070;
  do {
    bVar7 = dwarf::CUIter::NextCU(&local_100,local_2e0,(CU *)local_2d0);
    if (!bVar7) {
      if (p_Stack_228 != (_Manager_type)0x0) {
        (*p_Stack_228)(&_Stack_238,&_Stack_238,__destroy_functor);
      }
      if ((RangeSink *)local_2d0._96_8_ != (RangeSink *)(local_2d0 + 0x70)) {
        operator_delete((void *)local_2d0._96_8_,CONCAT71(local_2d0._113_7_,local_2d0[0x70]) + 1);
      }
      return;
    }
    local_300._0_8_ = local_2d0._24_8_;
    local_300._8_8_ = local_2d0._32_8_;
    local_300._16_4_ = 0;
    pcVar13 = (char *)0x0;
    local_e8.name.
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = false;
    local_e8.location_string.
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = false;
    local_e8.location_uint64.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.low_pc.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.high_pc_addr.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.high_pc_size.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.rnglistx.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.ranges.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.start_scope.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
    local_e8.declaration = false;
    local_338 = 0;
    local_330 = 0;
    local_320 = &local_310;
    local_318 = 0;
    local_310 = 0;
    local_340 = &local_330;
    pAVar8 = dwarf::DIEReader::ReadCode((DIEReader *)local_300,(CU *)local_2d0);
    sVar16._M_str = pcVar13;
    sVar16._M_len = in_R8;
    pAVar2 = (pAVar8->attr).
             super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar14 = (pAVar8->attr).
                   super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                   ._M_impl.super__Vector_impl_data._M_start; pAVar14 != pAVar2;
        pAVar14 = pAVar14 + 1) {
      uVar1 = pAVar14->name;
      data = (string_view *)local_300;
      dwarf::AttrValue::ParseAttr
                ((AttrValue *)&local_368.string_,(CU *)local_2d0,pAVar14->form,data);
      local_208 = local_358[0];
      local_218.uint_ = local_368.uint_;
      local_218.string_._M_str = local_368.string_._M_str;
      val.field_0.string_._M_str = local_368.string_._M_str;
      val.field_0.uint_ = local_368.uint_;
      val._16_8_ = local_358[0];
      ReadGeneralDIEAttr(uVar1,val,(CU *)local_2d0,&local_e8);
      sVar16._M_str = (char *)data;
      sVar16._M_len = in_R8;
      sVar6._M_str = (char *)data;
      sVar6._M_len = in_R8;
      sVar5._M_str = (char *)data;
      sVar5._M_len = in_R8;
      if (uVar1 == 0x2130) {
        if ((local_208._4_4_ & 0xfffffffd) == 1) {
          sVar16 = dwarf::AttrValue::GetString((AttrValue *)&local_218.string_,(CU *)local_2d0);
          plVar9 = &local_318;
          ppuVar12 = &local_320;
          goto LAB_001a3cff;
        }
      }
      else {
        sVar16 = sVar5;
        if ((uVar1 == 0x1b) && (sVar16 = sVar6, (local_208._4_4_ & 0xfffffffd) == 1)) {
          sVar16 = dwarf::AttrValue::GetString((AttrValue *)&local_218.string_,(CU *)local_2d0);
          plVar9 = &local_338;
          ppuVar12 = &local_340;
LAB_001a3cff:
          std::__cxx11::string::_M_replace((ulong)ppuVar12,0,(char *)*plVar9,(ulong)sVar16._M_str);
        }
      }
      in_R8 = sVar16._M_len;
    }
    pRVar11 = (RangeSink *)sVar16._M_len;
    if ((local_338 != 0) && (local_318 != 0)) {
      local_368.uint_ = (uint64_t)local_358;
      local_2d8 = (undefined1  [8])local_300._24_8_;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_368,local_340,local_340 + local_338);
      std::__cxx11::string::append((char *)&local_368.uint_);
      plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_368.uint_,(ulong)local_320);
      pppVar15 = (pointer *)(plVar9 + 2);
      if ((pointer *)*plVar9 == pppVar15) {
        local_208 = *pppVar15;
        ppStack_200 = (pointer)plVar9[3];
        local_218.uint_ = (uint64_t)&local_208;
      }
      else {
        local_208 = *pppVar15;
        local_218.uint_ = (uint64_t)(pointer *)*plVar9;
      }
      local_218.string_._M_str = (char *)plVar9[1];
      *plVar9 = (long)pppVar15;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      MmapInputFileFactory::OpenFile((MmapInputFileFactory *)&local_370,(string *)local_2d8);
      if ((undefined8 *)local_218.uint_ != &local_208) {
        operator_delete((void *)local_218.uint_,(ulong)((long)&local_208->first + 1));
      }
      if ((pointer *)local_368.uint_ != local_358) {
        operator_delete((void *)local_368.uint_,(ulong)((long)&local_358[0]->first + 1));
      }
      memset(&local_218,0,0xe0);
      (**(OpenDwarf **)(local_2d0._0_8_ + 0xe8))
                ((InputFile *)local_370._vptr_InputFileFactory,(File *)&local_218.string_,sink);
      pRVar10 = sink;
      ReadDWARFCompileUnits
                ((bloaty *)&local_218.string_,local_348,(DualMap *)local_2d0,(CU *)sink,pRVar11);
      sVar16._M_str = (char *)pRVar10;
      sVar16._M_len = (size_t)pRVar11;
      if ((InputFile *)local_370._vptr_InputFileFactory != (InputFile *)0x0) {
        (**(code **)(*local_370._vptr_InputFileFactory + 0x10))();
        sVar16._M_str = (char *)pRVar10;
        sVar16._M_len = (size_t)pRVar11;
      }
    }
    if ((Arena *)local_2d0._104_8_ != (Arena *)0x0) {
      p_Var3 = (_Base_ptr)(sink->file_->data_)._M_str;
      if ((p_Var3 <= (ulong)local_2d0._16_8_) &&
         ((ulong)local_2d0._16_8_ <
          (_Base_ptr)((long)&p_Var3->_M_color + (sink->file_->data_)._M_len))) {
        sVar17._M_str = (char *)local_2d0._96_8_;
        sVar17._M_len = local_2d0._104_8_;
        RangeSink::AddFileRange
                  (sink,"dwarf_debuginfo",sVar17,local_2d0._16_8_ - (long)p_Var3,local_2d0._8_8_);
      }
      AddDIE((CU *)local_2d0,&local_e8,(DualMap *)local_348,sink);
      if (local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged == true) {
        local_218.uint_ = ((string_view *)(local_2d0._0_8_ + 0x40))->_M_len;
        local_218.string_._M_str = ((string_view *)(local_2d0._0_8_ + 0x40))->_M_str;
        pppVar15 = (pointer *)
                   (local_218.uint_ -
                   (long)local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>.
                         _M_payload.super__Optional_payload_base<unsigned_long>._M_payload);
        if (local_218.uint_ <
            local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
          Throw("premature EOF reading variable-length DWARF data",0xad);
        }
        pcVar13 = (char *)((long)local_218.string_._M_str +
                          local_e8.stmt_list.super__Optional_base<unsigned_long,_true,_true>.
                          _M_payload.super__Optional_payload_base<unsigned_long>._M_payload._M_value
                          );
        local_218.uint_ = (uint64_t)pppVar15;
        local_218.string_._M_str = pcVar13;
        sVar17 = dwarf::CompilationUnitSizes::ReadInitialLength
                           ((CompilationUnitSizes *)&local_368.string_,&local_218.string_);
        local_218.uint_ = (uint64_t)(sVar17._M_str + (sVar17._M_len - (long)pcVar13));
        if (pppVar15 < sVar17._M_str + (sVar17._M_len - (long)pcVar13)) {
          local_218.uint_ = (uint64_t)pppVar15;
        }
        pcVar4 = (sink->file_->data_)._M_str;
        local_218.string_._M_str = pcVar13;
        if ((pcVar4 <= pcVar13) && (pcVar13 < pcVar4 + (sink->file_->data_)._M_len)) {
          name._M_str = (char *)local_2d0._96_8_;
          name._M_len = local_2d0._104_8_;
          RangeSink::AddFileRange
                    (sink,"dwarf_stmtlistrange",name,(long)pcVar13 - (long)pcVar4,local_218.uint_);
        }
      }
      pcVar13 = *(char **)&(((Options *)(local_2d0._48_8_ + 8))->base_filename_).
                           super_RepeatedPtrFieldBase.current_size_;
      pcVar4 = (sink->file_->data_)._M_str;
      pRVar11 = (RangeSink *)local_2d0._48_8_;
      if ((pcVar4 <= pcVar13) && (pcVar13 < pcVar4 + (sink->file_->data_)._M_len)) {
        pcVar13 = pcVar13 + -(long)pcVar4;
        name_00._M_str = (char *)local_2d0._96_8_;
        name_00._M_len = local_2d0._104_8_;
        pRVar11 = (RangeSink *)local_2d0._96_8_;
        RangeSink::AddFileRange
                  (sink,"dwarf_abbrev",name_00,(uint64_t)pcVar13,
                   (uint64_t)
                   (((Options *)(local_2d0._48_8_ + 8))->base_filename_).super_RepeatedPtrFieldBase.
                   arena_);
      }
      do {
        pAVar8 = dwarf::DIEReader::ReadCode((DIEReader *)local_300,(CU *)local_2d0);
        sVar16._M_str = (char *)pRVar11;
        sVar16._M_len = (size_t)pcVar13;
        if (pAVar8 == (Abbrev *)0x0) break;
        local_208 = (pointer)((ulong)local_208 & 0xffffffffffffff00);
        local_1f0 = 0;
        local_1e0 = 0;
        local_1d0 = '\0';
        local_1c0 = 0;
        local_1b0 = 0;
        local_1a0 = 0;
        local_190 = 0;
        local_180 = 0;
        local_170 = 0;
        local_168 = '\0';
        pAVar2 = (pAVar8->attr).
                 super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pAVar14 = (pAVar8->attr).
                       super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                       ._M_impl.super__Vector_impl_data._M_start; pAVar14 != pAVar2;
            pAVar14 = pAVar14 + 1) {
          uVar1 = pAVar14->name;
          pRVar11 = (RangeSink *)local_300;
          dwarf::AttrValue::ParseAttr
                    ((AttrValue *)&local_368.string_,(CU *)local_2d0,pAVar14->form,
                     (string_view *)pRVar11);
          val_00.field_0.string_._M_str = local_368.string_._M_str;
          val_00.field_0.uint_ = local_368.uint_;
          val_00._16_8_ = local_358[0];
          ReadGeneralDIEAttr(uVar1,val_00,(CU *)local_2d0,(GeneralDIE *)&local_218.string_);
        }
        if (((local_1d0 == '\x01') &&
            (bVar7 = dwarf::IsValidDwarfAddress(local_1d8,local_2d0[0x2b] * '\x04' + '\x04'), !bVar7
            )) || (local_168 == '\x01')) {
          dwarf::DIEReader::SkipChildren((DIEReader *)local_300,(CU *)local_2d0,pAVar8);
        }
        else {
          pRVar11 = sink;
          AddDIE((CU *)local_2d0,(GeneralDIE *)&local_218.string_,(DualMap *)local_348,sink);
        }
        sVar16._M_str = (char *)pRVar11;
        sVar16._M_len = (size_t)pcVar13;
      } while (pAVar8 != (Abbrev *)0x0);
    }
    if (local_320 != &local_310) {
      operator_delete(local_320,CONCAT71(uStack_30f,local_310) + 1);
    }
    in_R8 = sVar16._M_len;
    if (local_340 != &local_330) {
      operator_delete(local_340,CONCAT71(uStack_32f,local_330) + 1);
      in_R8 = sVar16._M_len;
    }
  } while( true );
}

Assistant:

static void ReadDWARFDebugInfo(dwarf::InfoReader& reader,
                               dwarf::InfoReader::Section section,
                               const DualMap& symbol_map, RangeSink* sink) {
  dwarf::CUIter iter = reader.GetCUIter(section);
  dwarf::CU cu;
  cu.SetIndirectStringCallback([sink, &cu](string_view str) {
    sink->AddFileRange("dwarf_strp", cu.unit_name(), str);
  });

  while (iter.NextCU(reader, &cu)) {
    dwarf::DIEReader die_reader = cu.GetDIEReader();
    GeneralDIE compileunit_die;
    DwoFilePointer dwo_info;
    auto* abbrev = die_reader.ReadCode(cu);
    die_reader.ReadAttributes(
        cu, abbrev,
        [&](uint16_t tag, dwarf::AttrValue value) {
          ReadGeneralDIEAttr(tag, value, cu, &compileunit_die);
          switch (tag) {
            case DW_AT_comp_dir:
              if (value.IsString()) {
                dwo_info.comp_dir = value.GetString(cu);
              }
              break;
            case DW_AT_GNU_dwo_name:
              if (value.IsString()) {
                dwo_info.dwo_name = value.GetString(cu);
              }
              break;
          }
        });

    if (!dwo_info.comp_dir.empty() && !dwo_info.dwo_name.empty()) {
      auto file = MmapInputFileFactory().OpenFile(dwo_info.comp_dir + "/" + dwo_info.dwo_name);
      dwarf::File dwo_dwarf;
      cu.dwarf().open(*file, &dwo_dwarf, sink);
      ReadDWARFCompileUnits(dwo_dwarf, symbol_map, &cu, sink);
    }

    if (cu.unit_name().empty()) {
      continue;
    }

    sink->AddFileRange("dwarf_debuginfo", cu.unit_name(), cu.entire_unit());
    AddDIE(cu, compileunit_die, symbol_map, sink);

    if (compileunit_die.stmt_list) {
      ReadDWARFStmtListRange(cu, *compileunit_die.stmt_list, sink);
    }

    sink->AddFileRange("dwarf_abbrev", cu.unit_name(), cu.unit_abbrev().abbrev_data());

    while (auto abbrev = die_reader.ReadCode(cu)) {
      GeneralDIE die;
      die_reader.ReadAttributes(
          cu, abbrev, [&cu, &die](uint16_t tag, dwarf::AttrValue value) {
            ReadGeneralDIEAttr(tag, value, cu, &die);
          });

      // low_pc == 0 is a signal that this routine was stripped out of the
      // final binary. Also any declaration should be skipped.
      if ((die.low_pc && !cu.IsValidDwarfAddress(*die.low_pc)) ||
          die.declaration) {
        die_reader.SkipChildren(cu, abbrev);
      } else {
        AddDIE(cu, die, symbol_map, sink);
      }
    }
  }
}